

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNQIn.cpp
# Opt level: O2

void __thiscall NaPNQueueInput::action(NaPNQueueInput *this)

{
  NaVector *this_00;
  int iVar1;
  NaVector *pNVar2;
  undefined4 extraout_var;
  uint uVar3;
  NaReal NVar4;
  
  this_00 = &this->vQueue;
  for (uVar3 = 0; uVar3 < this->nDataSize; uVar3 = uVar3 + 1) {
    NVar4 = NaVector::operator()(this_00,uVar3);
    pNVar2 = NaPetriCnOutput::data(&this->out);
    iVar1 = (*pNVar2->_vptr_NaVector[8])(pNVar2,(ulong)uVar3);
    *(NaReal *)CONCAT44(extraout_var,iVar1) = NVar4;
  }
  NaVector::shift(this_00,-this->nDataSize);
  uVar3 = NaVector::dim(this_00);
  NaVector::new_dim(this_00,uVar3 - this->nDataSize);
  return;
}

Assistant:

void
NaPNQueueInput::action ()
{
  unsigned	i;

  // Get data from the queue
  for(i = 0; i < nDataSize; ++i){
    out.data()[i] = vQueue(i);
  }

  // Remove data portion
  vQueue.shift(- (int)nDataSize);
  vQueue.new_dim(vQueue.dim() - nDataSize);
}